

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerCheckLowerIntBound(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *target;
  undefined4 *puVar4;
  Instr *instr_00;
  char *this_00;
  
  pIVar1 = instr->m_prev;
  this_00 = (char *)0x176;
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  if ((instr->m_src1->m_type | TyInt64) != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
    ;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x71cf,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32())",
                       "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  InsertCompareBranch((Lowerer *)this_00,instr->m_src1,instr->m_src2,BrGe_A,false,target,instr,false
                     );
  instr_00 = IR::Instr::New(CALL,instr->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr_00,HelperIntRangeCheckFailure,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckLowerIntBound(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, false /*isOpHelper*/);

    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32());
    InsertCompareBranch(instr->GetSrc1(), instr->GetSrc2(), Js::OpCode::BrGe_A, continueLabel, instr);

    IR::Instr* helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    instr->InsertBefore(helperCallInstr);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::HelperIntRangeCheckFailure);

    instr->InsertAfter(continueLabel);

    instr->Remove();

    return instrPrev;
}